

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBufferPool.cpp
# Opt level: O1

void __thiscall
VulkanUtilities::VulkanCommandBufferPool::RecycleCommandBuffer
          (VulkanCommandBufferPool *this,VkCommandBuffer *CmdBuffer)

{
  iterator *piVar1;
  _Elt_pointer ppVVar2;
  int iVar3;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->m_Mutex);
  if (iVar3 == 0) {
    ppVVar2 = (this->m_CmdBuffers).
              super__Deque_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar2 ==
        (this->m_CmdBuffers).
        super__Deque_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<VkCommandBuffer_T*,std::allocator<VkCommandBuffer_T*>>::
      _M_push_back_aux<VkCommandBuffer_T*&>
                ((deque<VkCommandBuffer_T*,std::allocator<VkCommandBuffer_T*>> *)&this->m_CmdBuffers
                 ,CmdBuffer);
    }
    else {
      *ppVVar2 = *CmdBuffer;
      piVar1 = &(this->m_CmdBuffers).
                super__Deque_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>._M_impl
                .super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    *CmdBuffer = (VkCommandBuffer)0x0;
    LOCK();
    (this->m_BuffCounter).super___atomic_base<int>._M_i =
         (this->m_BuffCounter).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

void VulkanCommandBufferPool::RecycleCommandBuffer(VkCommandBuffer&& CmdBuffer)
{
    std::lock_guard<std::mutex> Lock{m_Mutex};
    m_CmdBuffers.emplace_back(CmdBuffer);
    CmdBuffer = VK_NULL_HANDLE;
#ifdef DILIGENT_DEVELOPMENT
    --m_BuffCounter;
#endif
}